

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuCommandLine.cpp
# Opt level: O3

void __thiscall tcu::DebugOutStreambuf::DebugOutStreambuf(DebugOutStreambuf *this)

{
  *(code **)this = __cxa_guard_release;
  *(undefined8 *)&this->field_0x8 = 0;
  *(undefined8 *)&this->field_0x10 = 0;
  *(undefined8 *)&this->field_0x18 = 0;
  *(undefined8 *)&this->field_0x20 = 0;
  *(undefined8 *)&this->field_0x28 = 0;
  *(undefined8 *)&this->field_0x30 = 0;
  std::locale::locale((locale *)&this->field_0x38);
  *(undefined ***)this = &PTR__DebugOutStreambuf_003f22f0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&this->m_curLine);
  return;
}

Assistant:

DebugOutStreambuf::DebugOutStreambuf (void)
{
}